

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_200625d::BlendA64MaskTest8B_d16_RandomValues_Test::TestBody
          (BlendA64MaskTest8B_d16_RandomValues_Test *this)

{
  ACMRandom *this_00;
  bool bVar1;
  uint32_t uVar2;
  int bsize;
  int block_size;
  long lVar3;
  
  this_00 = &(this->super_BlendA64MaskTest8B_d16).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>
             .rng_;
  block_size = 0;
  do {
    bVar1 = testing::Test::HasFatalFailure();
    if (bVar1) {
      return;
    }
    lVar3 = 0x14020;
    do {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      *(char *)((long)this + lVar3 + -0x13fe8) = (char)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar3 + -0x20] = (uchar)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      *(ushort *)
       ((this->super_BlendA64MaskTest8B_d16).
        super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
        .dst_ref_ + lVar3 * 2 + -0x38) = (ushort)(uVar2 >> 0xf) & 0x3fff;
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .src0_[lVar3 + -0x1c] = (ushort)(uVar2 >> 0xf) & 0x3fff;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x28020);
    lVar3 = 0x78050;
    do {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64MaskTest8B_d16).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
      .dst_ref_[lVar3 + -0x38] = (uchar)uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x88050);
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*),_unsigned_short,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  } while (block_size != 0x16);
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}